

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O3

string * __thiscall
adios2::profiling::JSONProfiler::GetRankProfilingJSON
          (string *__return_storage_ptr__,JSONProfiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transportsTypes,
          vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
          *transportsProfilers)

{
  Timer *this_00;
  char *pcVar1;
  _Hash_node_base *p_Var2;
  ulong __val;
  IOChrono *pIVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  long *plVar8;
  iterator iVar9;
  undefined8 *puVar10;
  mapped_type *pmVar11;
  iterator iVar12;
  undefined8 uVar13;
  uint uVar14;
  uint uVar15;
  size_type *psVar16;
  ulong *puVar17;
  _Hash_node_base *p_Var18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_type sVar22;
  JSONProfiler *pJVar23;
  char cVar24;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_01;
  uint __len;
  JSONProfiler *pJVar25;
  uint uVar26;
  __hashtable *__h_2;
  __hashtable *__h_1;
  _Hash_node_base *p_Var27;
  __node_base *p_Var28;
  _Hash_node_base *__val_00;
  string __str_2;
  __hashtable *__h;
  string __str_5;
  string timeDate;
  string __str_1;
  key_type local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  JSONProfiler *local_108;
  char *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_> *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar26 = this->m_RankMPI;
  uVar15 = -uVar26;
  if (0 < (int)uVar26) {
    uVar15 = uVar26;
  }
  __len = 1;
  if (9 < uVar15) {
    uVar21 = (ulong)uVar15;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar14 = (uint)uVar21;
      if (uVar14 < 100) {
        __len = __len - 2;
        goto LAB_00620f82;
      }
      if (uVar14 < 1000) {
        __len = __len - 1;
        goto LAB_00620f82;
      }
      if (uVar14 < 10000) goto LAB_00620f82;
      uVar21 = uVar21 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar14);
    __len = __len + 1;
  }
LAB_00620f82:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_108 = this;
  local_e0 = transportsProfilers;
  local_d8 = transportsTypes;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len - (char)((int)uVar26 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_d0._M_dataplus._M_p + (uVar26 >> 0x1f),__len,uVar15);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x74cf73);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar16 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar16) {
    lVar5 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar16;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"buffering","");
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_108,&local_148);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,
               *(long *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                               ._M_cur + 0x60),
               *(long *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                               ._M_cur + 0x68) +
               *(long *)((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>,_true>
                               ._M_cur + 0x60));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    std::__cxx11::string::pop_back();
    if (local_d0._M_string_length != 0) {
      sVar22 = 0;
      do {
        if (local_d0._M_dataplus._M_p[sVar22] == ' ') {
          local_d0._M_dataplus._M_p[sVar22] = '_';
        }
        sVar22 = sVar22 + 1;
      } while (local_d0._M_string_length != sVar22);
    }
    std::operator+(&local_128,", \"start\":\"",&local_d0);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = puVar10[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_148._M_string_length = puVar10[1];
    *puVar10 = psVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    for (p_Var27 = (local_108->m_Profiler).m_Timers._M_h._M_before_begin._M_nxt;
        p_Var27 != (_Hash_node_base *)0x0; p_Var27 = p_Var27->_M_nxt) {
      if (p_Var27[0x14]._M_nxt != (_Hash_node_base *)0x0) {
        this_00 = (Timer *)(p_Var27 + 5);
        std::operator+(&local_50,",\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar17 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar17) {
          local_80 = *puVar17;
          lStack_78 = plVar8[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *puVar17;
          local_90 = (ulong *)*plVar8;
        }
        local_88 = plVar8[1];
        *plVar8 = (long)puVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        Timer::GetShortUnits_abi_cxx11_(&local_70,this_00);
        uVar21 = 0xf;
        if (local_90 != &local_80) {
          uVar21 = local_80;
        }
        if (uVar21 < local_70._M_string_length + local_88) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar13 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_70._M_string_length + local_88) goto LAB_00621271;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_00621271:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_100 = (char *)&local_f0;
        pcVar1 = (char *)(puVar10 + 2);
        if ((char *)*puVar10 == pcVar1) {
          local_f0 = *(undefined8 *)pcVar1;
          uStack_e8 = puVar10[3];
        }
        else {
          local_f0 = *(undefined8 *)pcVar1;
          local_100 = (char *)*puVar10;
        }
        local_f8 = puVar10[1];
        *puVar10 = pcVar1;
        puVar10[1] = 0;
        *pcVar1 = '\0';
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        puVar17 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_128.field_2._M_allocated_capacity = *puVar17;
          local_128.field_2._8_8_ = plVar8[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *puVar17;
          local_128._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_128._M_string_length = plVar8[1];
        *plVar8 = (long)puVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        p_Var2 = p_Var27[10]._M_nxt;
        __val_00 = (_Hash_node_base *)-(long)p_Var2;
        if (0 < (long)p_Var2) {
          __val_00 = p_Var2;
        }
        uVar26 = 1;
        if ((_Hash_node_base *)&DAT_00000009 < __val_00) {
          p_Var18 = __val_00;
          uVar15 = 4;
          do {
            uVar26 = uVar15;
            if (p_Var18 < (_Hash_node_base *)0x64) {
              uVar26 = uVar26 - 2;
              goto LAB_0062139e;
            }
            if (p_Var18 < (_Hash_node_base *)0x3e8) {
              uVar26 = uVar26 - 1;
              goto LAB_0062139e;
            }
            if (p_Var18 < (_Hash_node_base *)0x2710) goto LAB_0062139e;
            bVar4 = (_Hash_node_base *)0x1869f < p_Var18;
            p_Var18 = (_Hash_node_base *)((ulong)p_Var18 / 10000);
            uVar15 = uVar26 + 4;
          } while (bVar4);
          uVar26 = uVar26 + 1;
        }
LAB_0062139e:
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b0,(char)uVar26 - (char)((long)p_Var2 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_b0 - ((long)p_Var2 >> 0x3f)),uVar26,(unsigned_long)__val_00)
        ;
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          uVar13 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_a8 + local_128._M_string_length) {
          uVar21 = 0xf;
          if (local_b0 != local_a0) {
            uVar21 = local_a0[0];
          }
          if (uVar21 < local_a8 + local_128._M_string_length) goto LAB_00621434;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_b0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
        }
        else {
LAB_00621434:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_b0);
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar16 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148.field_2._8_8_ = puVar10[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = psVar16;
        puVar10[1] = 0;
        *(undefined1 *)psVar16 = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if (local_100 != (char *)&local_f0) {
          operator_delete(local_100);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        Timer::AddToJsonStr(this_00,__return_storage_ptr__,true);
      }
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"dataread","");
    this_01 = &(local_108->m_Profiler).m_Bytes;
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,&local_148);
    uVar21 = *pmVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"metadataread","");
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,&local_148);
    uVar20 = *pmVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"metametadataread","");
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,&local_148);
    __val = *pmVar11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    cVar24 = '\x01';
    if (9 < uVar21) {
      uVar19 = uVar21;
      cVar7 = '\x04';
      do {
        cVar24 = cVar7;
        if (uVar19 < 100) {
          cVar24 = cVar24 + -2;
          goto LAB_00621688;
        }
        if (uVar19 < 1000) {
          cVar24 = cVar24 + -1;
          goto LAB_00621688;
        }
        if (uVar19 < 10000) goto LAB_00621688;
        bVar4 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar7 = cVar24 + '\x04';
      } while (bVar4);
      cVar24 = cVar24 + '\x01';
    }
LAB_00621688:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar24);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar21);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x74cf8c);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = plVar8[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_148._M_string_length = plVar8[1];
    *plVar8 = (long)psVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    cVar24 = '\x01';
    if (9 < uVar20) {
      uVar21 = uVar20;
      cVar7 = '\x04';
      do {
        cVar24 = cVar7;
        if (uVar21 < 100) {
          cVar24 = cVar24 + -2;
          goto LAB_0062179c;
        }
        if (uVar21 < 1000) {
          cVar24 = cVar24 + -1;
          goto LAB_0062179c;
        }
        if (uVar21 < 10000) goto LAB_0062179c;
        bVar4 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        cVar7 = cVar24 + '\x04';
      } while (bVar4);
      cVar24 = cVar24 + '\x01';
    }
LAB_0062179c:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar24);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar20);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x74cf9b);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = plVar8[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_148._M_string_length = plVar8[1];
    *plVar8 = (long)psVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    cVar24 = '\x01';
    if (9 < __val) {
      uVar21 = __val;
      cVar7 = '\x04';
      do {
        cVar24 = cVar7;
        if (uVar21 < 100) {
          cVar24 = cVar24 + -2;
          goto LAB_006218b0;
        }
        if (uVar21 < 1000) {
          cVar24 = cVar24 + -1;
          goto LAB_006218b0;
        }
        if (uVar21 < 10000) goto LAB_006218b0;
        bVar4 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        cVar7 = cVar24 + '\x04';
      } while (bVar4);
      cVar24 = cVar24 + '\x01';
    }
LAB_006218b0:
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar24);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x74cfae);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    psVar16 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148.field_2._8_8_ = plVar8[3];
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar16;
      local_148._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_148._M_string_length = plVar8[1];
    *plVar8 = (long)psVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    local_108 = (JSONProfiler *)
                ((long)(local_d8->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_d8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    if (local_108 != (JSONProfiler *)0x0) {
      local_108 = (JSONProfiler *)((long)local_108 >> 5);
      pJVar25 = (JSONProfiler *)0x0;
      do {
        cVar24 = '\x01';
        uVar26 = (uint)pJVar25;
        if (9 < uVar26) {
          pJVar23 = pJVar25;
          cVar7 = '\x04';
          do {
            cVar24 = cVar7;
            uVar15 = (uint)pJVar23;
            if (uVar15 < 100) {
              cVar24 = cVar24 + -2;
              goto LAB_006219e5;
            }
            if (uVar15 < 1000) {
              cVar24 = cVar24 + -1;
              goto LAB_006219e5;
            }
            if (uVar15 < 10000) goto LAB_006219e5;
            pJVar23 = (JSONProfiler *)((ulong)pJVar23 / 10000);
            cVar7 = cVar24 + '\x04';
          } while (99999 < uVar15);
          cVar24 = cVar24 + '\x01';
        }
LAB_006219e5:
        local_100 = (char *)&local_f0;
        std::__cxx11::string::_M_construct((ulong)&local_100,cVar24);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_100,(uint)local_f8,uVar26);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x749d92);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        puVar17 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_128.field_2._M_allocated_capacity = *puVar17;
          local_128.field_2._8_8_ = puVar10[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *puVar17;
          local_128._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_128._M_string_length = puVar10[1];
        *puVar10 = puVar17;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar16 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148.field_2._8_8_ = plVar8[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_148._M_string_length = plVar8[1];
        *plVar8 = (long)psVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if (local_100 != (char *)&local_f0) {
          operator_delete(local_100);
        }
        std::operator+(&local_128,"\"type\":\"",
                       (local_d8->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (long)pJVar25);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar16 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148.field_2._8_8_ = puVar10[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar16;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = psVar16;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        pIVar3 = (local_e0->
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[(long)pJVar25];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"write","");
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pIVar3->m_Bytes)._M_h,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        pIVar3 = (local_e0->
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[(long)pJVar25];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"read","");
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(pIVar3->m_Bytes)._M_h,&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur != (__node_type *)0x0) {
            pIVar3 = (local_e0->
                     super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[(long)pJVar25];
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"read","");
            iVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pIVar3->m_Bytes)._M_h,&local_148);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur != (__node_type *)0x0) {
              uVar21 = *(ulong *)((long)iVar12.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x28);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p);
              }
              cVar24 = '\x01';
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              if (9 < uVar21) {
                uVar20 = uVar21;
                cVar7 = '\x04';
                do {
                  cVar24 = cVar7;
                  if (uVar20 < 100) {
                    cVar24 = cVar24 + -2;
                    goto LAB_00621e7b;
                  }
                  if (uVar20 < 1000) {
                    cVar24 = cVar24 + -1;
                    goto LAB_00621e7b;
                  }
                  if (uVar20 < 10000) goto LAB_00621e7b;
                  bVar4 = 99999 < uVar20;
                  uVar20 = uVar20 / 10000;
                  cVar7 = cVar24 + '\x04';
                } while (bVar4);
                cVar24 = cVar24 + '\x01';
              }
LAB_00621e7b:
              std::__cxx11::string::_M_construct((ulong)&local_128,cVar24);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar21);
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x74cfde);
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              psVar16 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_148.field_2._M_allocated_capacity = *psVar16;
                local_148.field_2._8_8_ = puVar10[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar16;
                local_148._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_148._M_string_length = puVar10[1];
              *puVar10 = psVar16;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
              goto LAB_00621f0b;
            }
            goto LAB_00621fba;
          }
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"write","");
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(pIVar3->m_Bytes)._M_h,&local_148);
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00621fba;
          uVar21 = *(ulong *)((long)iVar12.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x28);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          cVar24 = '\x01';
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          if (9 < uVar21) {
            uVar20 = uVar21;
            cVar7 = '\x04';
            do {
              cVar24 = cVar7;
              if (uVar20 < 100) {
                cVar24 = cVar24 + -2;
                goto LAB_00621ddf;
              }
              if (uVar20 < 1000) {
                cVar24 = cVar24 + -1;
                goto LAB_00621ddf;
              }
              if (uVar20 < 10000) goto LAB_00621ddf;
              bVar4 = 99999 < uVar20;
              uVar20 = uVar20 / 10000;
              cVar7 = cVar24 + '\x04';
            } while (bVar4);
            cVar24 = cVar24 + '\x01';
          }
LAB_00621ddf:
          std::__cxx11::string::_M_construct((ulong)&local_128,cVar24);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar21);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x74cfd2);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          psVar16 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_148.field_2._M_allocated_capacity = *psVar16;
            local_148.field_2._8_8_ = puVar10[3];
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar16;
            local_148._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_148._M_string_length = puVar10[1];
          *puVar10 = psVar16;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
LAB_00621f0b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
        }
        p_Var28 = &((local_e0->
                    super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[(long)pJVar25]->m_Timers)._M_h.
                   _M_before_begin;
        while (p_Var28 = p_Var28->_M_nxt, p_Var28 != (__node_base *)0x0) {
          Timer::AddToJsonStr((Timer *)(p_Var28 + 5),__return_storage_ptr__,true);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pJVar25 = (JSONProfiler *)(ulong)(uVar26 + 1);
      } while (pJVar25 < local_108);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
LAB_00621fba:
  uVar13 = std::__throw_out_of_range("_Map_base::at");
  __clang_call_terminate(uVar13);
}

Assistant:

std::string JSONProfiler::GetRankProfilingJSON(
    const std::vector<std::string> &transportsTypes,
    const std::vector<profiling::IOChrono *> &transportsProfilers) noexcept
{
    auto lf_WriterTimer = [](std::string &rankLog, const profiling::Timer &timer) {
        // rankLog += "\"" + timer.m_Process + "_" + timer.GetShortUnits() +
        //           "\": " + std::to_string(timer.m_ProcessTime) + ", ";
        timer.AddToJsonStr(rankLog);
    };

    // prepare string dictionary per rank
    std::string rankLog("{ \"rank\":" + std::to_string(m_RankMPI));

    auto &profiler = m_Profiler;

    std::string timeDate(profiler.m_Timers.at("buffering").m_LocalTimeDate);
    timeDate.pop_back();
    // avoid whitespace
    std::replace(timeDate.begin(), timeDate.end(), ' ', '_');

    rankLog += ", \"start\":\"" + timeDate + "\"";

    for (const auto &timerPair : profiler.m_Timers)
    {
        const profiling::Timer &timer = timerPair.second;
        if (timer.m_nCalls > 0)
        {
            rankLog += ",\"" + timer.m_Process + "_" + timer.GetShortUnits() +
                       "\": " + std::to_string(timer.m_ProcessTime);
            timer.AddToJsonStr(rankLog);
        }
    }

    size_t DataBytes = m_Profiler.m_Bytes["dataread"];
    size_t MetaDataBytes = m_Profiler.m_Bytes["metadataread"];
    size_t MetaMetaDataBytes = m_Profiler.m_Bytes["metametadataread"];
    rankLog += ", \"databytes\":" + std::to_string(DataBytes);
    rankLog += ", \"metadatabytes\":" + std::to_string(MetaDataBytes);
    rankLog += ", \"metametadatabytes\":" + std::to_string(MetaMetaDataBytes);

    const size_t transportsSize = transportsTypes.size();

    for (unsigned int t = 0; t < transportsSize; ++t)
    {
        rankLog += ", \"transport_" + std::to_string(t) + "\":{";
        rankLog += "\"type\":\"" + transportsTypes[t] + "\"";

        if (transportsProfilers[t]->m_Bytes.find("write") != transportsProfilers[t]->m_Bytes.end())
        {
            size_t wBytes = transportsProfilers[t]->m_Bytes.at("write");
            rankLog += ", \"wbytes\":" + std::to_string(wBytes);
        }
        else if (transportsProfilers[t]->m_Bytes.find("read") !=
                 transportsProfilers[t]->m_Bytes.end())
        {
            size_t rBytes = transportsProfilers[t]->m_Bytes.at("read");
            rankLog += ", \"rbytes\":" + std::to_string(rBytes);
        }

        for (const auto &transportTimerPair : transportsProfilers[t]->m_Timers)
        {
            lf_WriterTimer(rankLog, transportTimerPair.second);
        }
        rankLog += "}";
    }
    rankLog += " }"; // end rank entry

    return rankLog;
}